

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O2

void __thiscall HEkkDualRow::choosePossible(HEkkDualRow *this)

{
  double dVar1;
  char cVar2;
  int iVar3;
  int8_t *piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer ppVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  iVar11 = (this->ekk_instance_->info_).update_count;
  if (iVar11 < 10) {
    dVar14 = 1e-09;
  }
  else {
    dVar14 = *(double *)(&DAT_003b0da0 + (ulong)(iVar11 < 0x14) * 8);
  }
  piVar4 = this->workMove;
  dVar1 = (this->ekk_instance_->options_->super_HighsOptionsStruct).dual_feasibility_tolerance;
  this->workTheta = INFINITY;
  this->workCount = 0;
  piVar5 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar7 = (this->workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar8 = this->workDual;
  uVar12 = 0;
  uVar9 = (ulong)(uint)this->packCount;
  if (this->packCount < 1) {
    uVar9 = uVar12;
  }
  dVar15 = INFINITY;
  uVar13 = -(ulong)(this->workDelta < 0.0);
  iVar11 = 0;
  for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
    iVar3 = piVar5[uVar12];
    cVar2 = piVar4[iVar3];
    dVar16 = pdVar6[uVar12];
    dVar16 = (double)(~uVar13 & (ulong)dVar16 | (ulong)-dVar16 & uVar13) * (double)(int)cVar2;
    if (dVar14 < dVar16) {
      iVar10 = iVar11 + 1;
      this->workCount = iVar10;
      ppVar7[iVar11].first = iVar3;
      ppVar7[iVar11].second = dVar16;
      dVar17 = (double)(int)cVar2 * pdVar8[iVar3] + dVar1;
      iVar11 = iVar10;
      if (dVar17 < dVar16 * dVar15) {
        dVar15 = dVar17 / dVar16;
        this->workTheta = dVar15;
      }
    }
  }
  return;
}

Assistant:

void HEkkDualRow::choosePossible() {
  /**
   * Determine the possible variables - candidates for CHUZC
   * TODO: Check with Qi what this is doing
   */
  const double Ta = ekk_instance_.info_.update_count < 10   ? 1e-9
                    : ekk_instance_.info_.update_count < 20 ? 3e-8
                                                            : 1e-6;
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  const HighsInt move_out = workDelta < 0 ? -1 : 1;
  workTheta = kHighsInf;
  workCount = 0;

  for (HighsInt i = 0; i < packCount; i++) {
    const HighsInt iCol = packIndex[i];
    const HighsInt move = workMove[iCol];
    const double alpha = packValue[i] * move_out * move;
    if (alpha > Ta) {
      workData[workCount++] = make_pair(iCol, alpha);
      const double relax = workDual[iCol] * move + Td;
      if (workTheta * alpha > relax) workTheta = relax / alpha;
    }
  }
}